

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

CBNode * __thiscall asmjit::CodeBuilder::addAfter(CodeBuilder *this,CBNode *node,CBNode *ref)

{
  void *pvVar1;
  CBNode *pCVar2;
  CBNode *extraout_RAX;
  CBNode *pCVar3;
  CBNode **ppCVar4;
  CBNode *extraout_RDX;
  CBNode *pCVar5;
  CBNode *extraout_RDX_00;
  CBNode *pCVar6;
  bool bVar7;
  
  if (node == (CBNode *)0x0) {
    addAfter();
LAB_001128f0:
    addAfter();
LAB_001128f5:
    addAfter();
  }
  else {
    if (ref == (CBNode *)0x0) goto LAB_001128f0;
    if (node->_prev != (CBNode *)0x0) goto LAB_001128f5;
    if (node->_next == (CBNode *)0x0) {
      pCVar3 = ref->_next;
      node->_prev = ref;
      node->_next = pCVar3;
      ref->_next = node;
      pCVar6 = (CBNode *)&this->_lastNode;
      if (pCVar3 != (CBNode *)0x0) {
        pCVar6 = pCVar3;
      }
      pCVar6->_prev = node;
      return node;
    }
  }
  addAfter();
  if (node == (CBNode *)0x0) {
    addBefore();
LAB_00112944:
    addBefore();
  }
  else {
    if (node->_prev != (CBNode *)0x0) goto LAB_00112944;
    if (node->_next == (CBNode *)0x0) {
      if (extraout_RDX != (CBNode *)0x0) {
        pCVar3 = extraout_RDX->_prev;
        node->_prev = pCVar3;
        node->_next = extraout_RDX;
        extraout_RDX->_prev = node;
        ppCVar4 = &pCVar3->_next;
        if (pCVar3 == (CBNode *)0x0) {
          ppCVar4 = &this->_firstNode;
        }
        *ppCVar4 = node;
        return node;
      }
      goto LAB_0011294e;
    }
  }
  addBefore();
LAB_0011294e:
  addBefore();
  pCVar3 = node->_prev;
  ppCVar4 = &pCVar3->_next;
  if (this->_firstNode == node) {
    ppCVar4 = &this->_firstNode;
  }
  pCVar6 = node->_next;
  *ppCVar4 = pCVar6;
  pCVar5 = (CBNode *)&this->_lastNode;
  if (this->_lastNode != node) {
    pCVar5 = pCVar6;
  }
  pCVar5->_prev = pCVar3;
  node->_prev = (CBNode *)0x0;
  node->_next = (CBNode *)0x0;
  if (this->_cursor == node) {
    this->_cursor = pCVar3;
  }
  if (((node->_flags & 0x30) == 0) || (pvVar1 = node[1]._passData, pvVar1 == (void *)0x0)) {
    return node;
  }
  pCVar3 = (CBNode *)((long)pvVar1 + 0x30);
  while (pCVar6 = pCVar3->_prev, pCVar6 != (CBNode *)0x0) {
    if (pCVar6 == node) {
      pCVar3->_prev = node[2]._prev;
      *(int *)((long)pvVar1 + 0x2c) = *(int *)((long)pvVar1 + 0x2c) + -1;
      return node;
    }
    pCVar3 = pCVar6 + 2;
  }
  removeNode();
  if (node == extraout_RDX_00) {
    pCVar3 = removeNode(this,node);
    return pCVar3;
  }
  pCVar3 = node->_prev;
  pCVar6 = extraout_RDX_00->_next;
  ppCVar4 = &pCVar3->_next;
  if (this->_firstNode == node) {
    ppCVar4 = &this->_firstNode;
  }
  *ppCVar4 = pCVar6;
  pCVar5 = (CBNode *)&this->_lastNode;
  if (this->_lastNode != extraout_RDX_00) {
    pCVar5 = pCVar6;
  }
  pCVar5->_prev = pCVar3;
  do {
    pCVar6 = node->_next;
    if (pCVar6 == (CBNode *)0x0) {
LAB_00112a8a:
      removeNodes();
      pCVar3 = this->_cursor;
      this->_cursor = node;
      return pCVar3;
    }
    node->_prev = (CBNode *)0x0;
    node->_next = (CBNode *)0x0;
    if (this->_cursor == node) {
      this->_cursor = pCVar3;
    }
    if (((node->_flags & 0x30) != 0) && (pvVar1 = node[1]._passData, pvVar1 != (void *)0x0)) {
      pCVar5 = (CBNode *)((long)pvVar1 + 0x30);
      while( true ) {
        pCVar2 = pCVar5->_prev;
        if (pCVar2 == (CBNode *)0x0) {
          removeNodes();
          goto LAB_00112a8a;
        }
        if (pCVar2 == node) break;
        pCVar5 = pCVar2 + 2;
      }
      pCVar5->_prev = node[2]._prev;
      *(int *)((long)pvVar1 + 0x2c) = *(int *)((long)pvVar1 + 0x2c) + -1;
    }
    bVar7 = node == extraout_RDX_00;
    node = pCVar6;
    if (bVar7) {
      return extraout_RAX;
    }
  } while( true );
}

Assistant:

CBNode* CodeBuilder::addAfter(CBNode* node, CBNode* ref) noexcept {
  ASMJIT_ASSERT(node);
  ASMJIT_ASSERT(ref);

  ASMJIT_ASSERT(node->_prev == nullptr);
  ASMJIT_ASSERT(node->_next == nullptr);

  CBNode* prev = ref;
  CBNode* next = ref->_next;

  node->_prev = prev;
  node->_next = next;

  prev->_next = node;
  if (next)
    next->_prev = node;
  else
    _lastNode = node;

  return node;
}